

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O2

int main(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uStack_20;
  
  signal(2,sig_handler);
  mraa_init();
  lVar2 = mraa_gpio_init(0x17);
  if (lVar2 == 0) {
    uStack_20 = 0x17;
LAB_001012ff:
    fprintf(_stderr,"Failed to initialize GPIO %d\n",uStack_20);
  }
  else {
    lVar3 = mraa_gpio_init(0x18);
    if (lVar3 == 0) {
      uStack_20 = 0x18;
      goto LAB_001012ff;
    }
    iVar1 = mraa_gpio_dir(lVar2,0);
    if ((iVar1 == 0) && (iVar1 = mraa_gpio_dir(lVar3,0), iVar1 == 0)) {
      while (flag != 0) {
        iVar1 = mraa_gpio_write(lVar2,1);
        if ((iVar1 != 0) || (iVar1 = mraa_gpio_write(lVar3,0), iVar1 != 0)) goto LAB_0010126b;
        sleep(1);
        iVar1 = mraa_gpio_write(lVar2,0);
        if ((iVar1 != 0) || (iVar1 = mraa_gpio_write(lVar3,1), iVar1 != 0)) goto LAB_0010126b;
        sleep(1);
      }
      iVar1 = mraa_gpio_close(lVar2);
      if ((iVar1 == 0) && (iVar1 = mraa_gpio_close(lVar3), iVar1 == 0)) {
        iVar1 = 0;
        goto LAB_00101275;
      }
    }
LAB_0010126b:
    mraa_result_print(iVar1);
  }
  iVar1 = 1;
LAB_00101275:
  mraa_deinit();
  return iVar1;
}

Assistant:

int
main(void)
{
    mraa_result_t status = MRAA_SUCCESS;
    mraa_gpio_context gpio_1, gpio_2;

    /* install signal handler */
    signal(SIGINT, sig_handler);

    /* initialize mraa for the platform (not needed most of the times) */
    mraa_init();

    //! [Interesting]
    /* initialize GPIO pin */
    gpio_1 = mraa_gpio_init(GPIO_PIN_1);
    if (gpio_1 == NULL) {
        fprintf(stderr, "Failed to initialize GPIO %d\n", GPIO_PIN_1);
        mraa_deinit();
        return EXIT_FAILURE;
    }

    /* initialize GPIO pin */
    gpio_2 = mraa_gpio_init(GPIO_PIN_2);
    if (gpio_2 == NULL) {
        fprintf(stderr, "Failed to initialize GPIO %d\n", GPIO_PIN_2);
        mraa_deinit();
        return EXIT_FAILURE;
    }

    /* set GPIO to output */
    status = mraa_gpio_dir(gpio_1, MRAA_GPIO_OUT);
    if (status != MRAA_SUCCESS) {
        goto err_exit;
    }

    /* set GPIO to output */
    status = mraa_gpio_dir(gpio_2, MRAA_GPIO_OUT);
    if (status != MRAA_SUCCESS) {
        goto err_exit;
    }

    /* toggle both GPIO's */
    while (flag) {
        status = mraa_gpio_write(gpio_1, 1);
        if (status != MRAA_SUCCESS) {
            goto err_exit;
        }

        status = mraa_gpio_write(gpio_2, 0);
        if (status != MRAA_SUCCESS) {
            goto err_exit;
        }

        sleep(1);

        status = mraa_gpio_write(gpio_1, 0);
        if (status != MRAA_SUCCESS) {
            goto err_exit;
        }

        status = mraa_gpio_write(gpio_2, 1);
        if (status != MRAA_SUCCESS) {
            goto err_exit;
        }

        sleep(1);
    }

    /* release gpio's */
    status = mraa_gpio_close(gpio_1);
    if (status != MRAA_SUCCESS) {
        goto err_exit;
    }

    /* close GPIO */
    status = mraa_gpio_close(gpio_2);
    if (status != MRAA_SUCCESS) {
        goto err_exit;
    }

    //! [Interesting]
    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_SUCCESS;

err_exit:
    mraa_result_print(status);

    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_FAILURE;
}